

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalPrinter<std::optional<SDL_Rect>_>::Print
               (Optional<SDL_Rect> *value,ostream *os)

{
  bool bVar1;
  SDL_Rect *value_00;
  ostream *os_local;
  Optional<SDL_Rect> *value_local;
  
  std::operator<<(os,'(');
  bVar1 = std::optional::operator_cast_to_bool((optional *)value);
  if (bVar1) {
    value_00 = std::optional<SDL_Rect>::operator*(value);
    UniversalPrint<SDL_Rect>(value_00,os);
  }
  else {
    std::operator<<(os,"nullopt");
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }